

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O1

string * Imf_3_4::insertViewName
                   (string *__return_storage_ptr__,string *channel,StringVector *multiView,int i)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  long *plVar4;
  ulong uVar5;
  long *plVar6;
  char c;
  long lVar7;
  ulong uVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  StringVector s;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  StringVector local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  long *local_78 [2];
  long local_68 [2];
  StringVector *local_58;
  string local_50;
  
  pcVar2 = (channel->_M_dataplus)._M_p;
  local_58 = multiView;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + channel->_M_string_length);
  anon_unknown_5::parseString(&local_98,&local_50,c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    if ((i == 0) &&
       ((long)local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20)) {
      pcVar2 = (channel->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + channel->_M_string_length);
    }
    else {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      local_80 = paVar1;
      if ((long)local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        uVar5 = (long)local_98.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_98.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar9 = 8;
        uVar8 = 0;
        do {
          if (uVar8 < uVar5 - 1) {
            lVar7 = *(long *)((long)local_98.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar9 + -8);
            local_b8 = &local_a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,lVar7,
                       *(long *)((long)&((local_98.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar9) + lVar7);
            std::__cxx11::string::append((char *)&local_b8);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
            lVar7 = local_a8;
            plVar4 = local_b8;
            if (local_b8 != &local_a8) {
LAB_001932cb:
              operator_delete(plVar4,lVar7 + 1);
            }
          }
          else {
            pbVar3 = (local_58->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_78[0] = local_68;
            pcVar2 = pbVar3[i]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_78,pcVar2,pcVar2 + pbVar3[i]._M_string_length);
            std::__cxx11::string::append((char *)local_78);
            plVar4 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_78,
                                        *(ulong *)((long)local_98.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar9 + -8));
            plVar6 = plVar4 + 2;
            if ((long *)*plVar4 == plVar6) {
              local_a8 = *plVar6;
              lStack_a0 = plVar4[3];
              local_b8 = &local_a8;
            }
            else {
              local_a8 = *plVar6;
              local_b8 = (long *)*plVar4;
            }
            local_b0 = plVar4[1];
            *plVar4 = (long)plVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
            if (local_b8 != &local_a8) {
              operator_delete(local_b8,local_a8 + 1);
            }
            lVar7 = local_68[0];
            plVar4 = local_78[0];
            if (local_78[0] != local_68) goto LAB_001932cb;
          }
          uVar8 = uVar8 + 1;
          uVar5 = (long)local_98.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_98.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5;
          lVar9 = lVar9 + 0x20;
        } while (uVar8 < uVar5);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return __return_storage_ptr__;
}

Assistant:

string
insertViewName (const string& channel, const StringVector& multiView, int i)
{
    //
    // Insert multiView[i] into the channel name if appropriate.
    //

    StringVector s = parseString (channel, '.');

    if (s.size () == 0) return ""; // nothing in, nothing out

    if (s.size () == 1 && i == 0)
    {
        //
        // Channel in the default view, with no periods in its name.
        // Do not insert view name.
        //

        return channel;
    }

    //
    // View name becomes penultimate section of new channel name.
    //

    string newName;

    for (size_t j = 0; j < s.size (); ++j)
    {
        if (j < s.size () - 1)
            newName += s[j] + ".";
        else
            newName += multiView[i] + "." + s[j];
    }

    return newName;
}